

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_ternary_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token_00;
  gnode_t *stmt1;
  gnode_t *stmt2;
  gnode_t *pgVar2;
  gnode_t *decl;
  gtoken_s token;
  gtoken_s end_token;
  
  pgVar2 = parser->current_node;
  if (pgVar2 != (gnode_t *)0x0) {
    lexer = parser->lexer->p[parser->lexer->n - 1];
    gravity_lexer_token(lexer);
    stmt1 = parse_expression(parser);
    if (stmt1 != (gnode_t *)0x0) {
      parse_required(parser,TOK_OP_COLON);
      stmt2 = parse_expression(parser);
      if (stmt2 != (gnode_t *)0x0) {
        gravity_lexer_token(lexer);
        sVar1 = parser->declarations->n;
        if (sVar1 == 0) {
          decl = (gnode_t *)0x0;
        }
        else {
          decl = parser->declarations->p[sVar1 - 1];
        }
        token_00.position = token.position;
        token_00.colno = token.colno;
        token_00._0_8_ = token._0_8_;
        token_00._16_8_ = token._16_8_;
        token_00._24_8_ = token._24_8_;
        token_00.value = token.value;
        pgVar2 = gnode_flow_stat_create
                           (token_00,pgVar2,stmt1,stmt2,decl,
                            (end_token.length + end_token.position) - token.position);
        return pgVar2;
      }
    }
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_ternary_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_ternary_expression");
    DECLARE_LEXER;

    // conditional expression already parsed
    gnode_t *cond = parser->current_node;
    if (!cond) return NULL;

    // '?' expression ':' expression

    // '?' already consumed
    gtoken_s token = gravity_lexer_token(lexer);

    // parse expression 1
    gnode_t *expr1 = parse_expression(parser);
    CHECK_NODE(expr1);

    parse_required(parser, TOK_OP_COLON);

    // parse expression 2
    gnode_t *expr2 = parse_expression(parser);
    CHECK_NODE(expr2);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_flow_stat_create(token, cond, expr1, expr2, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}